

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnector.cpp
# Opt level: O0

void __thiscall hwnet::TCPConnector::~TCPConnector(TCPConnector *this)

{
  bool bVar1;
  element_type *this_00;
  undefined1 local_20 [8];
  shared_ptr<hwnet::util::Timer> sp;
  TCPConnector *this_local;
  
  (this->super_Task)._vptr_Task = (_func_int **)&PTR_Do_00183c60;
  (this->super_Channel)._vptr_Channel = (_func_int **)&DAT_00183c98;
  sp.super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::weak_ptr<hwnet::util::Timer>::lock((weak_ptr<hwnet::util::Timer> *)local_20);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_20);
  if (bVar1) {
    this_00 = std::__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_20);
    util::Timer::cancel(this_00);
  }
  std::shared_ptr<hwnet::util::Timer>::~shared_ptr((shared_ptr<hwnet::util::Timer> *)local_20);
  std::weak_ptr<hwnet::util::Timer>::~weak_ptr(&this->connectTimer);
  std::function<void_(int,_const_hwnet::Addr_&)>::~function(&this->errorCallback_);
  std::function<void_(int)>::~function(&this->connectCallback_);
  std::enable_shared_from_this<hwnet::TCPConnector>::~enable_shared_from_this
            (&this->super_enable_shared_from_this<hwnet::TCPConnector>);
  Channel::~Channel(&this->super_Channel);
  Task::~Task(&this->super_Task);
  return;
}

Assistant:

TCPConnector::~TCPConnector() {
	if(auto sp = this->connectTimer.lock()) {
		sp->cancel();
	}
}